

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O2

Parsekey __thiscall
free_format_parser::HMpsFF::parseHessian
          (HMpsFF *this,HighsLogOptions *log_options,istream *file,Parsekey keyword)

{
  bool bVar1;
  Parsekey PVar2;
  HighsInt HVar3;
  size_t sVar4;
  size_t *end;
  HMpsFF *this_00;
  HMpsFF *this_01;
  int iVar5;
  pointer pcVar6;
  bool is_nan;
  bool skip;
  Parsekey local_130;
  HighsInt local_12c;
  HighsLogOptions *local_128;
  Parsekey local_11c;
  HMpsFF *local_118;
  HMpsFF *local_110;
  size_t local_108;
  istream *local_100;
  size_t begin;
  string col_name;
  string local_d0;
  string coeff_name;
  string row_name;
  string section_name;
  string strline;
  
  section_name._M_dataplus._M_p = (pointer)&section_name.field_2;
  section_name._M_string_length = 0;
  section_name.field_2._M_local_buf[0] = '\0';
  local_128 = log_options;
  local_100 = file;
  if ((keyword == kQmatrix) || (this_00 = this, keyword == kQuadobj)) {
    this_00 = (HMpsFF *)&section_name;
    std::__cxx11::string::assign((char *)this_00);
  }
  strline._M_dataplus._M_p = (pointer)&strline.field_2;
  strline._M_string_length = 0;
  strline.field_2._M_local_buf[0] = '\0';
  col_name._M_dataplus._M_p = (pointer)&col_name.field_2;
  col_name._M_string_length = 0;
  row_name._M_dataplus._M_p = (pointer)&row_name.field_2;
  row_name._M_string_length = 0;
  col_name.field_2._M_local_buf[0] = '\0';
  row_name.field_2._M_local_buf[0] = '\0';
  coeff_name._M_dataplus._M_p = (pointer)&coeff_name.field_2;
  coeff_name._M_string_length = 0;
  coeff_name.field_2._M_local_buf[0] = '\0';
  local_118 = (HMpsFF *)&this->q_entries;
  local_130 = kFail;
  local_11c = keyword;
  local_110 = this;
  do {
    do {
      this_01 = this;
      bVar1 = getMpsLine(this_00,local_100,&strline,&skip);
      if (!bVar1) {
LAB_00225d87:
        std::__cxx11::string::~string((string *)&coeff_name);
        std::__cxx11::string::~string((string *)&row_name);
        std::__cxx11::string::~string((string *)&col_name);
        std::__cxx11::string::~string((string *)&strline);
        std::__cxx11::string::~string((string *)&section_name);
        return local_130;
      }
      this = this_01;
    } while (skip != false);
    bVar1 = timeout(this_01);
    if (bVar1) {
      local_130 = kTimeout;
      goto LAB_00225d87;
    }
    begin = 0;
    local_108 = 0;
    end = &local_108;
    PVar2 = checkFirstWord(this_01,&strline,&begin,end,&col_name);
    if (PVar2 != kNone) {
      highsLogDev(local_128,kInfo,"readMPS: Read %s OK\n",section_name._M_dataplus._M_p);
      local_130 = PVar2;
      goto LAB_00225d87;
    }
    local_12c = getColIdx(this_01,&col_name,true);
    iVar5 = 3;
    sVar4 = local_108;
    do {
      iVar5 = iVar5 + -1;
      this_00 = this_01;
      this = local_110;
      if (iVar5 == 0) break;
      std::__cxx11::string::assign((char *)&row_name);
      first_word(&local_d0,&strline,sVar4);
      std::__cxx11::string::operator=((string *)&row_name,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      sVar4 = first_word_end(&strline,sVar4);
      this_00 = (HMpsFF *)&row_name;
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &row_name,"");
      this = local_110;
      if (bVar1) break;
      std::__cxx11::string::assign((char *)&coeff_name);
      first_word(&local_d0,&strline,sVar4);
      std::__cxx11::string::operator=((string *)&coeff_name,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      sVar4 = first_word_end(&strline,sVar4);
      bVar1 = std::operator==(&coeff_name,"");
      if (bVar1) {
        trim(&row_name,&default_non_chars_abi_cxx11_);
        trim(&col_name,&default_non_chars_abi_cxx11_);
        highsLogUser(local_128,kError,"%s has no coefficient for entry \"%s\" in column \"%s\"\n",
                     section_name._M_dataplus._M_p,row_name._M_dataplus._M_p,
                     col_name._M_dataplus._M_p);
        goto LAB_00225d87;
      }
      this_01 = local_110;
      HVar3 = getColIdx(local_110,&row_name,true);
      is_nan = false;
      pcVar6 = (pointer)getValue(this_01,&coeff_name,&is_nan,(HighsInt)end);
      if (is_nan == true) {
        highsLogUser(local_128,kError,
                     "Hessian coefficient for entry \"%s\" in column \"%s\" is NaN\n",
                     row_name._M_dataplus._M_p,col_name._M_dataplus._M_p);
        goto LAB_00225d87;
      }
      if (((double)pcVar6 != 0.0) || (NAN((double)pcVar6))) {
        if (local_11c == kQmatrix) {
          if (local_12c <= HVar3) {
            local_d0._M_string_length._0_4_ = local_12c;
            this_01 = local_118;
            local_d0._M_dataplus._M_p = pcVar6;
            local_d0._M_string_length._4_4_ = HVar3;
            std::vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>::
            emplace_back<std::tuple<int,int,double>>
                      ((vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>
                        *)local_118,(tuple<int,_int,_double> *)&local_d0);
          }
        }
        else {
          local_d0._M_string_length._0_4_ = local_12c;
          this_01 = local_118;
          local_d0._M_dataplus._M_p = pcVar6;
          local_d0._M_string_length._4_4_ = HVar3;
          std::vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>::
          emplace_back<std::tuple<int,int,double>>
                    ((vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>
                      *)local_118,(tuple<int,_int,_double> *)&local_d0);
        }
      }
      this_00 = this_01;
      this = local_110;
    } while (sVar4 != strline._M_string_length);
  } while( true );
}

Assistant:

typename HMpsFF::Parsekey HMpsFF::parseHessian(
    const HighsLogOptions& log_options, std::istream& file,
    const HMpsFF::Parsekey keyword) {
  // Parse Hessian information from QUADOBJ or QMATRIX
  // section according to keyword
  const bool qmatrix = keyword == HMpsFF::Parsekey::kQmatrix;
  std::string section_name;
  if (qmatrix) {
    section_name = "QMATRIX";
  } else if (keyword == HMpsFF::Parsekey::kQuadobj) {
    section_name = "QUADOBJ";
  }
  std::string strline;
  std::string col_name;
  std::string row_name;
  std::string coeff_name;
  size_t end_row_name;
  size_t end_coeff_name;
  HighsInt colidx, rowidx;

  bool skip;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    size_t begin = 0;
    size_t end = 0;
    HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, col_name);

    // start of new section?
    if (key != Parsekey::kNone) {
      highsLogDev(log_options, HighsLogType::kInfo, "readMPS: Read %s OK\n",
                  section_name.c_str());
      return key;
    }

    // Get the column index from the name
    colidx = getColIdx(col_name);
    assert(colidx >= 0 && colidx < num_col);

    // Loop over the maximum of two entries per row of the file
    for (int entry = 0; entry < 2; entry++) {
      // Get the row name
      row_name = "";
      row_name = first_word(strline, end);
      end_row_name = first_word_end(strline, end);

      if (row_name == "") break;

      coeff_name = "";
      coeff_name = first_word(strline, end_row_name);
      end_coeff_name = first_word_end(strline, end_row_name);

      if (coeff_name == "") {
        trim(row_name);
        trim(col_name);
        highsLogUser(
            log_options, HighsLogType::kError,
            "%s has no coefficient for entry \"%s\" in column \"%s\"\n",
            section_name.c_str(), row_name.c_str(), col_name.c_str());
        return HMpsFF::Parsekey::kFail;
      }

      rowidx = getColIdx(row_name);
      assert(rowidx >= 0 && rowidx < num_col);

      bool is_nan = false;
      double coeff = getValue(coeff_name, is_nan);  // atof(word.c_str());
      if (is_nan) {
        highsLogUser(
            log_options, HighsLogType::kError,
            "Hessian coefficient for entry \"%s\" in column \"%s\" is NaN\n",
            row_name.c_str(), col_name.c_str());
        return HMpsFF::Parsekey::kFail;
      }
      if (coeff) {
        if (qmatrix) {
          // QMATRIX has the whole Hessian, so store the entry if the
          // entry is in the lower triangle
          if (rowidx >= colidx)
            q_entries.push_back(std::make_tuple(rowidx, colidx, coeff));
        } else {
          // QSECTION and QUADOBJ has the lower triangle of the
          // Hessian
          q_entries.push_back(std::make_tuple(rowidx, colidx, coeff));
          //          if (rowidx != colidx)
          //            q_entries.push_back(std::make_tuple(colidx, rowidx,
          //            coeff));
        }
      }
      end = end_coeff_name;
      // Don't read more if end of line reached
      if (end == strline.length()) break;
    }
  }

  return HMpsFF::Parsekey::kFail;
}